

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_idte(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  _Bool _Var1;
  int val;
  TCGv_i32 local_28;
  TCGv_i32 m4;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = s390_has_feat(s->uc,S390_FEAT_LOCAL_TLB_CLEARING);
  if (_Var1) {
    val = get_field1(s,FLD_O_m4,FLD_C_b4);
    local_28 = tcg_const_i32_s390x(tcg_ctx_00,val);
  }
  else {
    local_28 = tcg_const_i32_s390x(tcg_ctx_00,0);
  }
  gen_helper_idte(tcg_ctx_00,tcg_ctx_00->cpu_env,o->in1,o->in2,local_28);
  tcg_temp_free_i32(tcg_ctx_00,local_28);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_idte(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 m4;

    if (s390_has_feat(s->uc, S390_FEAT_LOCAL_TLB_CLEARING)) {
        m4 = tcg_const_i32(tcg_ctx, get_field(s, m4));
    } else {
        m4 = tcg_const_i32(tcg_ctx, 0);
    }
    gen_helper_idte(tcg_ctx, tcg_ctx->cpu_env, o->in1, o->in2, m4);
    tcg_temp_free_i32(tcg_ctx, m4);
    return DISAS_NEXT;
}